

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::FramebufferAttachmentLayeredCase::iterate
          (FramebufferAttachmentLayeredCase *this)

{
  ostringstream *this_00;
  ostringstream *this_01;
  ostringstream *poVar1;
  CaseType CVar2;
  TestLog *log;
  bool bVar3;
  int iVar4;
  ContextType ctxType;
  GLenum GVar5;
  undefined4 extraout_var;
  long lVar6;
  char *pcVar7;
  GLint layer;
  int face;
  int iVar8;
  GLint layered;
  CallLogWrapper gl;
  Texture texture;
  Enum<int,_2UL> local_1f0;
  ScopedLogSection section;
  Framebuffer fbo;
  undefined1 local_1b0 [384];
  
  iVar4 = (*((this->super_GeometryShaderFeartureTestCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&gl,(Functions *)CONCAT44(extraout_var,iVar4),
             ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.
              super_TestNode.m_testCtx)->m_log);
  gl.m_enableLog = true;
  tcu::TestContext::setTestResult
            ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.
             super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  this_00 = (ostringstream *)(local_1b0 + 8);
  this_01 = (ostringstream *)(local_1b0 + 8);
  lVar6 = 0;
  do {
    if (lVar6 == 6) {
      glu::CallLogWrapper::~CallLogWrapper(&gl);
      return STOP;
    }
    log = ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.super_TestNode
          .m_testCtx)->m_log;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b0,iterate::textureTypes[lVar6].name,(allocator<char> *)&texture);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fbo,iterate::textureTypes[lVar6].description,(allocator<char> *)&local_1f0
              );
    tcu::ScopedLogSection::ScopedLogSection(&section,log,(string *)local_1b0,(string *)&fbo);
    std::__cxx11::string::~string((string *)&fbo);
    std::__cxx11::string::~string((string *)local_1b0);
    glu::TypedObjectWrapper<(glu::ObjectType)3>::TypedObjectWrapper
              ((TypedObjectWrapper<(glu::ObjectType)3> *)&fbo,
               ((this->super_GeometryShaderFeartureTestCase).super_TestCase.m_context)->m_renderCtx)
    ;
    glu::TypedObjectWrapper<(glu::ObjectType)0>::TypedObjectWrapper
              (&texture,((this->super_GeometryShaderFeartureTestCase).super_TestCase.m_context)->
                        m_renderCtx);
    layered = -1;
    glu::CallLogWrapper::glBindFramebuffer(&gl,0x8ca9,fbo.super_ObjectWrapper.m_object);
    CVar2 = iterate::textureTypes[lVar6].type;
    switch(CVar2) {
    case TEXTURE_3D:
    case TEXTURE_3D_LAYER:
      glu::CallLogWrapper::glBindTexture(&gl,0x806f,texture.super_ObjectWrapper.m_object);
      glu::CallLogWrapper::glTexImage3D
                (&gl,0x806f,0,0x8058,0x20,0x20,0x20,0,0x1908,0x1401,(void *)0x0);
      glu::CallLogWrapper::glTexParameteri(&gl,0x806f,0x2800,0x2600);
      glu::CallLogWrapper::glTexParameteri(&gl,0x806f,0x2801,0x2600);
      layer = 2;
      if (CVar2 == TEXTURE_3D) goto LAB_011ec84b;
LAB_011ec731:
      glu::CallLogWrapper::glFramebufferTextureLayer
                (&gl,0x8ca9,0x8ce0,texture.super_ObjectWrapper.m_object,0,layer);
      break;
    case TEXTURE_2D_ARRAY:
    case TEXTURE_2D_ARRAY_LAYER:
      glu::CallLogWrapper::glBindTexture(&gl,0x8c1a,texture.super_ObjectWrapper.m_object);
      glu::CallLogWrapper::glTexImage3D
                (&gl,0x8c1a,0,0x8058,0x20,0x20,0x20,0,0x1908,0x1401,(void *)0x0);
      glu::CallLogWrapper::glTexParameteri(&gl,0x8c1a,0x2800,0x2600);
      glu::CallLogWrapper::glTexParameteri(&gl,0x8c1a,0x2801,0x2600);
      layer = 3;
      if (CVar2 != TEXTURE_2D_ARRAY) goto LAB_011ec731;
      goto LAB_011ec84b;
    case TEXTURE_CUBE:
      glu::CallLogWrapper::glBindTexture(&gl,0x8513,texture.super_ObjectWrapper.m_object);
      iVar8 = 0;
      iVar4 = 6;
      while (bVar3 = iVar4 != 0, iVar4 = iVar4 + -1, bVar3) {
        glu::CallLogWrapper::glTexImage2D
                  (&gl,iVar8 + 0x8515,0,0x8058,0x20,0x20,0,0x1908,0x1401,(void *)0x0);
        iVar8 = iVar8 + 1;
      }
      glu::CallLogWrapper::glTexParameteri(&gl,0x8513,0x2800,0x2600);
      glu::CallLogWrapper::glTexParameteri(&gl,0x8513,0x2801,0x2600);
LAB_011ec84b:
      glu::CallLogWrapper::glFramebufferTexture
                (&gl,0x8ca9,0x8ce0,texture.super_ObjectWrapper.m_object,0);
      break;
    case TEXTURE_2D_MS_ARRAY:
      ctxType.super_ApiType.m_bits =
           (ApiType)(*((this->super_GeometryShaderFeartureTestCase).super_TestCase.m_context)->
                      m_renderCtx->_vptr_RenderContext[2])();
      bVar3 = glu::contextSupports(ctxType,(ApiType)0x23);
      if ((bVar3) ||
         (bVar3 = glu::ContextInfo::isExtensionSupported
                            (((this->super_GeometryShaderFeartureTestCase).super_TestCase.m_context)
                             ->m_contextInfo,"GL_OES_texture_storage_multisample_2d_array"), bVar3))
      {
        glu::CallLogWrapper::glBindTexture(&gl,0x9102,texture.super_ObjectWrapper.m_object);
        glu::CallLogWrapper::glTexStorage3DMultisample(&gl,0x9102,1,0x8058,0x20,0x20,0x20,'\0');
        goto LAB_011ec84b;
      }
      local_1b0._0_8_ =
           ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.
            super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,
                      "Context is not equal or greather than 3.2 and GL_OES_texture_storage_multisample_2d_array not supported, skipping."
                     );
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      goto LAB_011eca48;
    }
    GVar5 = glu::CallLogWrapper::glGetError(&gl);
    glu::checkError(GVar5,"setup attachment",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                    ,0x13f6);
    glu::CallLogWrapper::glGetFramebufferAttachmentParameteriv(&gl,0x8ca9,0x8ce0,0x8da7,&layered);
    GVar5 = glu::CallLogWrapper::glGetError(&gl);
    glu::checkError(GVar5,"getFramebufferParameteriv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                    ,0x13f9);
    local_1b0._0_8_ =
         ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.super_TestNode.
         m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,"GL_FRAMEBUFFER_ATTACHMENT_LAYERED = ");
    local_1f0.m_getName = glu::getBooleanName;
    local_1f0.m_value = layered;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1f0,(ostream *)this_00);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    if ((uint)layered < 2) {
      bVar3 = iterate::textureTypes[lVar6].layered;
      if (bVar3 != (layered == 1)) {
        local_1b0._0_8_ =
             ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.
              super_TestNode.m_testCtx)->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,"Error, expected ");
        pcVar7 = "mapped_ == GL_FALSE";
        if (bVar3 != false) {
          pcVar7 = "mapped_ == GL_TRUE";
        }
        std::operator<<((ostream *)poVar1,pcVar7 + 0xb);
        std::operator<<((ostream *)poVar1,", got ");
        local_1f0.m_getName = glu::getBooleanName;
        local_1f0.m_value = layered;
        tcu::Format::Enum<int,_2UL>::toStream(&local_1f0,(ostream *)poVar1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        pcVar7 = "invalid layer count";
        goto LAB_011eca3c;
      }
    }
    else {
      local_1b0._0_8_ =
           ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.
            super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream(this_01);
      std::operator<<((ostream *)this_01,"Error, expected boolean, got ");
      std::ostream::operator<<(this_01,layered);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_01);
      pcVar7 = "invalid boolean";
LAB_011eca3c:
      tcu::TestContext::setTestResult
                ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.
                 super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,pcVar7);
    }
LAB_011eca48:
    glu::ObjectWrapper::~ObjectWrapper(&texture.super_ObjectWrapper);
    glu::ObjectWrapper::~ObjectWrapper(&fbo.super_ObjectWrapper);
    tcu::ScopedLogSection::~ScopedLogSection(&section);
    lVar6 = lVar6 + 1;
  } while( true );
}

Assistant:

FramebufferAttachmentLayeredCase::IterateResult FramebufferAttachmentLayeredCase::iterate (void)
{
	enum CaseType
	{
		TEXTURE_3D,
		TEXTURE_2D_ARRAY,
		TEXTURE_CUBE,
		TEXTURE_2D_MS_ARRAY,
		TEXTURE_3D_LAYER,
		TEXTURE_2D_ARRAY_LAYER,
	};

	static const struct TextureType
	{
		const char*	name;
		const char*	description;
		bool		layered;
		CaseType	type;
	} textureTypes[] =
	{
		{ "3D",				"3D texture",			true,	TEXTURE_3D				},
		{ "2DArray",		"2D array",				true,	TEXTURE_2D_ARRAY		},
		{ "Cube",			"Cube map",				true,	TEXTURE_CUBE			},
		{ "2DMSArray",		"2D multisample array",	true,	TEXTURE_2D_MS_ARRAY		},
		{ "3DLayer",		"3D texture layer ",	false,	TEXTURE_3D_LAYER		},
		{ "2DArrayLayer",	"2D array layer ",		false,	TEXTURE_2D_ARRAY_LAYER	},
	};

	glu::CallLogWrapper gl(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	gl.enableLogging(true);

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(textureTypes); ++ndx)
	{
		const tcu::ScopedLogSection section			(m_testCtx.getLog(), textureTypes[ndx].name, textureTypes[ndx].description);
		const glu::Framebuffer		fbo				(m_context.getRenderContext());
		const glu::Texture			texture			(m_context.getRenderContext());
		glw::GLint					layered			= -1;

		gl.glBindFramebuffer(GL_DRAW_FRAMEBUFFER, *fbo);

		if (textureTypes[ndx].type == TEXTURE_3D || textureTypes[ndx].type == TEXTURE_3D_LAYER)
		{
			gl.glBindTexture(GL_TEXTURE_3D, *texture);
			gl.glTexImage3D(GL_TEXTURE_3D, 0, GL_RGBA8, 32, 32, 32, 0, GL_RGBA, GL_UNSIGNED_BYTE, DE_NULL);
			gl.glTexParameteri(GL_TEXTURE_3D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			gl.glTexParameteri(GL_TEXTURE_3D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);

			if (textureTypes[ndx].type == TEXTURE_3D)
				gl.glFramebufferTexture(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, *texture, 0);
			else
				gl.glFramebufferTextureLayer(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, *texture, 0, 2);
		}
		else if (textureTypes[ndx].type == TEXTURE_2D_ARRAY || textureTypes[ndx].type == TEXTURE_2D_ARRAY_LAYER)
		{
			gl.glBindTexture(GL_TEXTURE_2D_ARRAY, *texture);
			gl.glTexImage3D(GL_TEXTURE_2D_ARRAY, 0, GL_RGBA8, 32, 32, 32, 0, GL_RGBA, GL_UNSIGNED_BYTE, DE_NULL);
			gl.glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			gl.glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MIN_FILTER, GL_NEAREST);

			if (textureTypes[ndx].type == TEXTURE_2D_ARRAY)
				gl.glFramebufferTexture(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, *texture, 0);
			else
				gl.glFramebufferTextureLayer(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, *texture, 0, 3);
		}
		else if (textureTypes[ndx].type == TEXTURE_CUBE)
		{
			gl.glBindTexture(GL_TEXTURE_CUBE_MAP, *texture);
			for (int face = 0; face < 6; ++face)
				gl.glTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_X + face, 0, GL_RGBA8, 32, 32, 0, GL_RGBA, GL_UNSIGNED_BYTE, DE_NULL);
			gl.glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			gl.glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
			gl.glFramebufferTexture(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, *texture, 0);
		}
		else if (textureTypes[ndx].type == TEXTURE_2D_MS_ARRAY)
		{
			// check extension
			if (!glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2)) && !m_context.getContextInfo().isExtensionSupported("GL_OES_texture_storage_multisample_2d_array"))
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Context is not equal or greather than 3.2 and GL_OES_texture_storage_multisample_2d_array not supported, skipping." << tcu::TestLog::EndMessage;
				continue;
			}

			gl.glBindTexture(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, *texture);
			gl.glTexStorage3DMultisample(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, 1, GL_RGBA8, 32, 32, 32, GL_FALSE);
			gl.glFramebufferTexture(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, *texture, 0);
		}

		GLU_EXPECT_NO_ERROR(gl.glGetError(), "setup attachment");

		gl.glGetFramebufferAttachmentParameteriv(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_FRAMEBUFFER_ATTACHMENT_LAYERED, &layered);
		GLU_EXPECT_NO_ERROR(gl.glGetError(), "getFramebufferParameteriv");

		m_testCtx.getLog() << tcu::TestLog::Message << "GL_FRAMEBUFFER_ATTACHMENT_LAYERED = " << glu::getBooleanStr(layered) << tcu::TestLog::EndMessage;

		if (layered != GL_TRUE && layered != GL_FALSE)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Error, expected boolean, got " << layered << tcu::TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "invalid boolean");
		}
		else if ((layered == GL_TRUE) != textureTypes[ndx].layered)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Error, expected " << ((textureTypes[ndx].layered) ? ("GL_TRUE") : ("GL_FALSE")) << ", got " << glu::getBooleanStr(layered) << tcu::TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "invalid layer count");
		}
	}

	return STOP;
}